

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

pair<int_*,_bool>
HighsHashTree<int,_int>::insert_recurse
          (NodePtr *insertNode,uint64_t hash,int hashPos,HighsHashTableEntry<int,_int> *entry)

{
  int *piVar1;
  byte bVar2;
  uint uVar3;
  InnerLeaf<1> *this;
  ValueType *pVVar4;
  undefined8 *puVar5;
  sbyte sVar6;
  int iVar7;
  long lVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar9;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  ulong uVar10;
  undefined8 extraout_RDX_03;
  int i_2;
  ulong uVar11;
  int i_4;
  int hashPos_00;
  undefined8 *puVar12;
  ulong uVar13;
  uint numChilds;
  long lVar14;
  Entry *pEVar15;
  int i_1;
  InnerLeaf<4> *this_00;
  BranchNode *pBVar16;
  pair<int_*,_bool> pVar17;
  pair<int_*,_bool> pVar18;
  pair<int_*,_bool> pVar19;
  ulong uStack_b0;
  undefined8 local_70;
  array<unsigned_char,_55UL> sizes;
  
  uVar11 = insertNode->ptrAndType;
  switch((uint)uVar11 & 7) {
  case 0:
    if (hashPos != 9) {
      this = (InnerLeaf<1> *)operator_new(0x78);
      (this->occupation).occupation = 0;
      this->size = 0;
      (this->hashes)._M_elems[0] = 0;
      insertNode->ptrAndType = (ulong)this | 2;
      pVar17 = InnerLeaf<1>::insert_entry(this,hash,hashPos,entry);
      return pVar17;
    }
    puVar5 = (undefined8 *)operator_new(0x18);
    *puVar5 = 0;
    *(HighsHashTableEntry<int,_int> *)(puVar5 + 1) = *entry;
    *(undefined4 *)(puVar5 + 2) = 1;
    insertNode->ptrAndType = (ulong)puVar5 | 1;
    uVar9 = extraout_RDX;
    goto LAB_00289387;
  case 1:
    puVar5 = (undefined8 *)(uVar11 & 0xfffffffffffffff8);
    do {
      puVar12 = puVar5;
      if (*(int *)(puVar12 + 1) == entry->key_) {
        uVar9 = 0;
        goto LAB_0028947f;
      }
      puVar5 = (undefined8 *)*puVar12;
    } while ((undefined8 *)*puVar12 != (undefined8 *)0x0);
    puVar5 = (undefined8 *)operator_new(0x10);
    *puVar5 = 0;
    *(HighsHashTableEntry<int,_int> *)(puVar5 + 1) = *entry;
    *puVar12 = puVar5;
    piVar1 = (int *)((undefined8 *)(uVar11 & 0xfffffffffffffff8) + 2);
    *piVar1 = *piVar1 + 1;
    uVar9 = CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),1);
    puVar12 = puVar5;
LAB_0028947f:
    pVar18._8_8_ = uVar9;
    pVar18.first = (int *)((long)puVar12 + 0xc);
    break;
  case 2:
    pVar18 = insert_into_leaf<1>(insertNode,(InnerLeaf<1> *)(uVar11 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 3:
    pVar18 = insert_into_leaf<2>(insertNode,(InnerLeaf<2> *)(uVar11 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 4:
    pVar18 = insert_into_leaf<3>(insertNode,(InnerLeaf<3> *)(uVar11 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 5:
    this_00 = (InnerLeaf<4> *)(uVar11 & 0xfffffffffffffff8);
    if (this_00->size < 0x36) {
      pVar17 = InnerLeaf<4>::insert_entry(this_00,hash,hashPos,entry);
      return pVar17;
    }
    pVVar4 = InnerLeaf<4>::find_entry(this_00,hash,hashPos,&entry->key_);
    if (pVVar4 != (ValueType *)0x0) {
      pVar17._8_8_ = 0;
      pVar17.first = pVVar4;
      return pVar17;
    }
    uVar3 = (uint)(hash >> ((char)hashPos * -6 + 0x3aU & 0x3f)) & 0x3f;
    uVar11 = (this_00->occupation).occupation | 1L << (ulong)uVar3;
    lVar14 = POPCOUNT(uVar11);
    numChilds = (uint)lVar14;
    pBVar16 = createBranchingNode(numChilds);
    insertNode->ptrAndType = (ulong)pBVar16 | 6;
    (pBVar16->occupation).occupation = uVar11;
    hashPos_00 = hashPos + 1;
    sVar6 = (sbyte)uVar3;
    if (hashPos_00 != 9) {
      if (numChilds < 2) {
        insertNode = pBVar16->child;
        pBVar16->child[0].ptrAndType = (ulong)this_00 | 5;
        InnerLeaf<4>::rehash(this_00,hashPos_00);
      }
      else {
        uVar3 = this_00->size;
        local_70 = (ulong)uVar3;
        iVar7 = (uVar3 - numChilds) + 2;
        if (iVar7 < 7) {
          for (lVar8 = 0; lVar14 != lVar8; lVar8 = lVar8 + 1) {
            puVar5 = (undefined8 *)operator_new(0x78);
            *puVar5 = 0;
            *(undefined4 *)(puVar5 + 1) = 0;
            puVar5[2] = 0;
            pBVar16->child[lVar8].ptrAndType = (ulong)puVar5 | 2;
          }
          pEVar15 = (this_00->entries)._M_elems;
          uVar13 = local_70;
          for (lVar14 = 0; lVar14 < (int)uVar13; lVar14 = lVar14 + 1) {
            InnerLeaf<1>::insert_entry
                      ((InnerLeaf<1> *)
                       (pBVar16->child
                        [POPCOUNT(uVar11 >> ((byte)((uint)pEVar15[-0x37].key_ >> 10) & 0x3f)) + -1].
                        ptrAndType & 0xfffffffffffffff8),
                       (ulong)(uint)pEVar15->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20
                       ^ (ulong)(uint)pEVar15->key_ * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,
                       hashPos_00,pEVar15);
            uVar13 = (ulong)(uint)this_00->size;
            pEVar15 = pEVar15 + 1;
          }
          operator_delete(this_00);
          pVar19 = InnerLeaf<1>::insert_entry
                             ((InnerLeaf<1> *)
                              (pBVar16->child[POPCOUNT(uVar11 >> sVar6) + -1].ptrAndType &
                              0xfffffffffffffff8),hash,hashPos_00,entry);
          hashPos_00 = hashPos;
        }
        else {
          sizes._M_elems[0x20] = '\0';
          sizes._M_elems[0x21] = '\0';
          sizes._M_elems[0x22] = '\0';
          sizes._M_elems[0x23] = '\0';
          sizes._M_elems[0x24] = '\0';
          sizes._M_elems[0x25] = '\0';
          sizes._M_elems[0x26] = '\0';
          sizes._M_elems[0x27] = '\0';
          sizes._M_elems[0x28] = '\0';
          sizes._M_elems[0x29] = '\0';
          sizes._M_elems[0x2a] = '\0';
          sizes._M_elems[0x2b] = '\0';
          sizes._M_elems[0x2c] = '\0';
          sizes._M_elems[0x2d] = '\0';
          sizes._M_elems[0x2e] = '\0';
          sizes._M_elems[0x10] = '\0';
          sizes._M_elems[0x11] = '\0';
          sizes._M_elems[0x12] = '\0';
          sizes._M_elems[0x13] = '\0';
          sizes._M_elems[0x14] = '\0';
          sizes._M_elems[0x15] = '\0';
          sizes._M_elems[0x16] = '\0';
          sizes._M_elems[0x17] = '\0';
          sizes._M_elems[0x18] = '\0';
          sizes._M_elems[0x19] = '\0';
          sizes._M_elems[0x1a] = '\0';
          sizes._M_elems[0x1b] = '\0';
          sizes._M_elems[0x1c] = '\0';
          sizes._M_elems[0x1d] = '\0';
          sizes._M_elems[0x1e] = '\0';
          sizes._M_elems[0x1f] = '\0';
          sizes._M_elems[0] = '\0';
          sizes._M_elems[1] = '\0';
          sizes._M_elems[2] = '\0';
          sizes._M_elems[3] = '\0';
          sizes._M_elems[4] = '\0';
          sizes._M_elems[5] = '\0';
          sizes._M_elems[6] = '\0';
          sizes._M_elems[7] = '\0';
          sizes._M_elems[8] = '\0';
          sizes._M_elems[9] = '\0';
          sizes._M_elems[10] = '\0';
          sizes._M_elems[0xb] = '\0';
          sizes._M_elems[0xc] = '\0';
          sizes._M_elems[0xd] = '\0';
          sizes._M_elems[0xe] = '\0';
          sizes._M_elems[0xf] = '\0';
          sizes._M_elems[0x2f] = '\0';
          sizes._M_elems[0x30] = '\0';
          sizes._M_elems[0x31] = '\0';
          sizes._M_elems[0x32] = '\0';
          sizes._M_elems[0x33] = '\0';
          sizes._M_elems[0x34] = '\0';
          sizes._M_elems[0x35] = '\0';
          sizes._M_elems[0x36] = '\0';
          sizes._M_elems[POPCOUNT(uVar11 >> sVar6) + -1] =
               sizes._M_elems[POPCOUNT(uVar11 >> sVar6) + -1] + '\x01';
          uVar13 = 0;
          uVar10 = 0;
          if (0 < (int)uVar3) {
            uVar10 = (ulong)uVar3;
          }
          for (; uVar10 != uVar13; uVar13 = uVar13 + 1) {
            sizes._M_elems
            [POPCOUNT(uVar11 >> ((byte)((uint)(this_00->hashes)._M_elems[uVar13] >> 10) & 0x3f)) +
             -1] = sizes._M_elems
                   [POPCOUNT(uVar11 >> ((byte)((uint)(this_00->hashes)._M_elems[uVar13] >> 10) &
                                       0x3f)) + -1] + '\x01';
          }
          for (lVar8 = 0; lVar14 != lVar8; lVar8 = lVar8 + 1) {
            switch(sizes._M_elems[lVar8] + 9 >> 4) {
            case 0:
              puVar5 = (undefined8 *)operator_new(0x78);
              uStack_b0 = 2;
              break;
            case 1:
              puVar5 = (undefined8 *)operator_new(0x178);
              uStack_b0 = 3;
              break;
            case 2:
              puVar5 = (undefined8 *)operator_new(0x278);
              uStack_b0 = 4;
              break;
            case 3:
              puVar5 = (undefined8 *)operator_new(0x378);
              uStack_b0 = 5;
              break;
            default:
              goto switchD_0028987b_default;
            }
            *puVar5 = 0;
            *(undefined4 *)(puVar5 + 1) = 0;
            puVar5[2] = 0;
            pBVar16->child[lVar8].ptrAndType = uStack_b0 | (ulong)puVar5;
switchD_0028987b_default:
          }
          pEVar15 = (this_00->entries)._M_elems;
          uVar13 = local_70;
          for (lVar14 = 0; lVar14 < (int)uVar13; lVar14 = lVar14 + 1) {
            uVar13 = pBVar16->child
                     [POPCOUNT(uVar11 >> ((byte)((uint)pEVar15[-0x37].key_ >> 10) & 0x3f)) + -1].
                     ptrAndType;
            switch((uint)uVar13 & 7) {
            case 2:
              InnerLeaf<1>::insert_entry
                        ((InnerLeaf<1> *)(uVar13 & 0xfffffffffffffff8),
                         (ulong)(uint)pEVar15->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                         0x20 ^ (ulong)(uint)pEVar15->key_ * -0x75e7c76a1153eaca +
                                0x1da24fc66dd63e32,hashPos_00,pEVar15);
              break;
            case 3:
              InnerLeaf<2>::insert_entry
                        ((InnerLeaf<2> *)(uVar13 & 0xfffffffffffffff8),
                         (ulong)(uint)pEVar15->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                         0x20 ^ (ulong)(uint)pEVar15->key_ * -0x75e7c76a1153eaca +
                                0x1da24fc66dd63e32,hashPos_00,pEVar15);
              break;
            case 4:
              InnerLeaf<3>::insert_entry
                        ((InnerLeaf<3> *)(uVar13 & 0xfffffffffffffff8),
                         (ulong)(uint)pEVar15->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                         0x20 ^ (ulong)(uint)pEVar15->key_ * -0x75e7c76a1153eaca +
                                0x1da24fc66dd63e32,hashPos_00,pEVar15);
              break;
            case 5:
              InnerLeaf<4>::insert_entry
                        ((InnerLeaf<4> *)(uVar13 & 0xfffffffffffffff8),
                         (ulong)(uint)pEVar15->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                         0x20 ^ (ulong)(uint)pEVar15->key_ * -0x75e7c76a1153eaca +
                                0x1da24fc66dd63e32,hashPos_00,pEVar15);
            }
            uVar13 = (ulong)(uint)this_00->size;
            pEVar15 = pEVar15 + 1;
          }
          operator_delete(this_00);
          pVar19._8_8_ = extraout_RDX_03;
          pVar19.first = &pEVar15->key_;
          insertNode = pBVar16->child + POPCOUNT(uVar11 >> sVar6) + -1;
        }
        if (iVar7 < 7) {
          return pVar19;
        }
      }
      goto LAB_00289510;
    }
    for (lVar8 = 0; lVar14 != lVar8; lVar8 = lVar8 + 1) {
      pBVar16->child[lVar8].ptrAndType = 0;
    }
    for (lVar14 = 0; lVar14 < this_00->size; lVar14 = lVar14 + 1) {
      lVar8 = POPCOUNT(uVar11 >> ((byte)((uint)(this_00->hashes)._M_elems[lVar14] >> 10) & 0x3f));
      uVar13 = pBVar16->child[lVar8 + -1].ptrAndType;
      if ((uVar13 & 7) == 0) {
        puVar5 = (undefined8 *)operator_new(0x18);
        *puVar5 = 0;
        *(HighsHashTableEntry<int,_int> *)(puVar5 + 1) = (this_00->entries)._M_elems[lVar14];
        *(undefined4 *)(puVar5 + 2) = 1;
        pBVar16->child[lVar8 + -1].ptrAndType = (ulong)puVar5 | 1;
      }
      else {
        puVar12 = (undefined8 *)(uVar13 & 0xfffffffffffffff8);
        puVar5 = (undefined8 *)operator_new(0x10);
        uVar9 = puVar12[1];
        *puVar5 = *puVar12;
        puVar5[1] = uVar9;
        *puVar12 = puVar5;
        *(HighsHashTableEntry<int,_int> *)(puVar12 + 1) = (this_00->entries)._M_elems[lVar14];
        *(int *)(puVar12 + 2) = *(int *)(puVar12 + 2) + 1;
      }
    }
    operator_delete(this_00);
    uVar13 = pBVar16->child[POPCOUNT(uVar11 >> sVar6) + -1].ptrAndType;
    if ((uVar13 & 7) == 0) {
      puVar5 = (undefined8 *)operator_new(0x18);
      *puVar5 = 0;
      *(HighsHashTableEntry<int,_int> *)(puVar5 + 1) = *entry;
      *(undefined4 *)(puVar5 + 2) = 1;
      pBVar16->child[POPCOUNT(uVar11 >> sVar6) + -1].ptrAndType = (ulong)puVar5 | 1;
      uVar9 = extraout_RDX_02;
    }
    else {
      puVar5 = (undefined8 *)(uVar13 & 0xfffffffffffffff8);
      puVar12 = (undefined8 *)operator_new(0x10);
      uVar9 = puVar5[1];
      *puVar12 = *puVar5;
      puVar12[1] = uVar9;
      *puVar5 = puVar12;
      *(HighsHashTableEntry<int,_int> *)(puVar5 + 1) = *entry;
      *(int *)(puVar5 + 2) = *(int *)(puVar5 + 2) + 1;
      uVar9 = extraout_RDX_01;
    }
LAB_00289387:
    pVar18._9_7_ = (int7)((ulong)uVar9 >> 8);
    pVar18.second = true;
    pVar18.first = (int *)((long)puVar5 + 0xc);
    break;
  case 6:
    uVar13 = hash >> ((char)hashPos * -6 + 0x3aU & 0x3f);
    pBVar16 = (BranchNode *)(uVar11 & 0xfffffffffffffff8);
    uVar11 = (pBVar16->occupation).occupation;
    bVar2 = (byte)uVar13;
    lVar14 = POPCOUNT(uVar11 >> (bVar2 & 0x3f));
    if ((uVar11 >> (uVar13 & 0x3f) & 1) == 0) {
      pBVar16 = addChildToBranchNode(pBVar16,bVar2 & 0x3f,(int)lVar14);
      pBVar16->child[lVar14].ptrAndType = 0;
      (pBVar16->occupation).occupation = (pBVar16->occupation).occupation | 1L << (bVar2 & 0x3f);
    }
    else {
      lVar14 = lVar14 + -1;
    }
    insertNode->ptrAndType = (ulong)pBVar16 | 6;
    hashPos_00 = hashPos + 1;
    insertNode = pBVar16->child + lVar14;
    goto LAB_00289510;
  case 7:
    hashPos_00 = hashPos;
LAB_00289510:
    pVar18 = insert_recurse(insertNode,hash,hashPos_00,entry);
  }
  return pVar18;
}

Assistant:

static std::pair<ValueType*, bool> insert_recurse(
      NodePtr* insertNode, uint64_t hash, int hashPos,
      HighsHashTableEntry<K, V>& entry) {
    switch (insertNode->getType()) {
      case kEmpty: {
        if (hashPos == kMaxDepth) {
          ListLeaf* leaf = new ListLeaf(std::move(entry));
          *insertNode = leaf;
          return std::make_pair(&leaf->first.entry.value(), true);
        } else {
          InnerLeaf<1>* leaf = new InnerLeaf<1>;
          *insertNode = leaf;
          return leaf->insert_entry(hash, hashPos, entry);
        }
      }
      case kListLeaf: {
        ListLeaf* leaf = insertNode->getListLeaf();
        ListNode* iter = &leaf->first;
        while (true) {
          // check for existing key
          if (iter->entry.key() == entry.key())
            return std::make_pair(&iter->entry.value(), false);

          if (iter->next == nullptr) {
            // reached the end of the list and key is not duplicate, so insert
            iter->next = new ListNode(std::move(entry));
            ++leaf->count;
            return std::make_pair(&iter->next->entry.value(), true);
          }
          iter = iter->next;
        }

        break;
      }
      case kInnerLeafSizeClass1:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass1(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass2:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass2(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass3:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass3(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = insertNode->getInnerLeafSizeClass4();
        if (leaf->size < InnerLeaf<4>::capacity())
          return leaf->insert_entry(hash, hashPos, entry);

        auto existingEntry = leaf->find_entry(hash, hashPos, entry.key());
        if (existingEntry) return std::make_pair(existingEntry, false);
        Occupation occupation = leaf->occupation;

        uint8_t hashChunk = get_hash_chunk(hash, hashPos);
        occupation.set(hashChunk);

        int branchSize = occupation.num_set();

        BranchNode* branch = createBranchingNode(branchSize);
        *insertNode = branch;
        branch->occupation = occupation;

        if (hashPos + 1 == kMaxDepth) {
          for (int i = 0; i < branchSize; ++i) branch->child[i] = nullptr;

          for (int i = 0; i < leaf->size; ++i) {
            int pos =
                occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                1;
            if (branch->child[pos].getType() == kEmpty)
              branch->child[pos] = new ListLeaf(std::move(leaf->entries[i]));
            else {
              ListLeaf* listLeaf = branch->child[pos].getListLeaf();
              ListNode* newNode = new ListNode(std::move(listLeaf->first));
              listLeaf->first.next = newNode;
              listLeaf->first.entry = std::move(leaf->entries[i]);
              ++listLeaf->count;
            }
          }

          delete leaf;

          ListLeaf* listLeaf;

          int pos = occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
          if (branch->child[pos].getType() == kEmpty) {
            listLeaf = new ListLeaf(std::move(entry));
            branch->child[pos] = listLeaf;
          } else {
            listLeaf = branch->child[pos].getListLeaf();
            ListNode* newNode = new ListNode(std::move(listLeaf->first));
            listLeaf->first.next = newNode;
            listLeaf->first.entry = std::move(entry);
            ++listLeaf->count;
          }

          return std::make_pair(&listLeaf->first.entry.value(), true);
        }

        if (branchSize > 1) {
          // maxsize in one bucket = number of items - (num buckets-1)
          // since each bucket has at least 1 item the largest one can only
          // have all remaining ones After adding the item: If it does not
          // collide
          int maxEntriesPerLeaf = 2 + leaf->size - branchSize;

          if (maxEntriesPerLeaf <= InnerLeaf<1>::capacity()) {
            // all items can go into the smallest leaf size
            for (int i = 0; i < branchSize; ++i)
              branch->child[i] = new InnerLeaf<1>;

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                  compute_hash(leaf->entries[i].key()), hashPos + 1,
                  leaf->entries[i]);
            }

            delete leaf;

            int pos =
                occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
            return branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                hash, hashPos + 1, entry);
          } else {
            // there are many collisions, determine the exact sizes first
            std::array<uint8_t, InnerLeaf<4>::capacity() + 1> sizes = {};
            sizes[occupation.num_set_until(hashChunk) - 1] += 1;
            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              sizes[pos] += 1;
            }

            for (int i = 0; i < branchSize; ++i) {
              switch (entries_to_size_class(sizes[i])) {
                case 1:
                  branch->child[i] = new InnerLeaf<1>;
                  break;
                case 2:
                  branch->child[i] = new InnerLeaf<2>;
                  break;
                case 3:
                  branch->child[i] = new InnerLeaf<3>;
                  break;
                case 4:
                  branch->child[i] = new InnerLeaf<4>;
                  break;
                default:
                  // Unexpected result from 'entries_to_size_class'
                  assert(false);
              }
            }

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;

              switch (branch->child[pos].getType()) {
                case kInnerLeafSizeClass1:
                  branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass2:
                  branch->child[pos].getInnerLeafSizeClass2()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass3:
                  branch->child[pos].getInnerLeafSizeClass3()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass4:
                  branch->child[pos].getInnerLeafSizeClass4()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                default:
                  break;
              }
            }
          }

          delete leaf;

          int pos = occupation.num_set_until(hashChunk) - 1;
          insertNode = &branch->child[pos];
          ++hashPos;
        } else {
          // extremely unlikely that the new branch node only gets one
          // child in that case create it and defer the insertion into
          // the next depth
          branch->child[0] = leaf;
          insertNode = &branch->child[0];
          ++hashPos;
          leaf->rehash(hashPos);
        }

        break;
      }
      case kBranchNode: {
        BranchNode* branch = insertNode->getBranchNode();

        int location =
            branch->occupation.num_set_until(get_hash_chunk(hash, hashPos));

        if (branch->occupation.test(get_hash_chunk(hash, hashPos))) {
          --location;
        } else {
          branch = addChildToBranchNode(branch, get_hash_chunk(hash, hashPos),
                                        location);

          branch->child[location] = nullptr;
          branch->occupation.set(get_hash_chunk(hash, hashPos));
        }

        *insertNode = branch;
        insertNode = &branch->child[location];
        ++hashPos;
      }
    }

    return insert_recurse(insertNode, hash, hashPos, entry);
  }